

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::Variable::glslTraverseBasicTypeArray
          (string *__return_storage_ptr__,Variable *this,int numArrayElements,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  pointer pcVar1;
  string traversedName;
  VarType type;
  string local_70;
  BasicTypeVisitFunc local_50;
  VarType local_48;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  local_50 = visit;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (this->m_name)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  if (numArrayElements < 0) {
    glu::VarType::VarType(&local_48,&this->m_type);
  }
  else {
    glu::VarType::VarType(&local_48,&this->m_type,numArrayElements);
  }
  glslTraverseBasicTypes(__return_storage_ptr__,&local_70,&local_48,0,indentationDepth,local_50);
  glu::VarType::~VarType(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::Variable::glslTraverseBasicTypeArray (int numArrayElements, int indentationDepth, BasicTypeVisitFunc visit) const
{
	DE_ASSERT(m_isArray);

	const bool				traverseAsArray		= numArrayElements >= 0;
	const string			traversedName		= m_name + (!traverseAsArray ? "[gl_InvocationID]" : "");
	const glu::VarType		type				= traverseAsArray ? glu::VarType(m_type, numArrayElements) : m_type;

	return UserDefinedIOCase::glslTraverseBasicTypes(traversedName, type, 0, indentationDepth, visit);
}